

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitCallRef(PrintExpressionContents *this,CallRef *curr)

{
  ostream *o;
  HeapType type;
  char *__str;
  string_view local_28;
  CallRef *local_18;
  CallRef *curr_local;
  PrintExpressionContents *this_local;
  
  o = this->o;
  __str = "call_ref ";
  if ((curr->isReturn & 1U) != 0) {
    __str = "return_call_ref ";
  }
  local_18 = curr;
  curr_local = (CallRef *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,__str);
  printMedium(o,local_28);
  type = wasm::Type::getHeapType(&local_18->target->type);
  printHeapTypeName(this,type);
  return;
}

Assistant:

void visitCallRef(CallRef* curr) {
    printMedium(o, curr->isReturn ? "return_call_ref " : "call_ref ");
    printHeapTypeName(curr->target->type.getHeapType());
  }